

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfparse.c
# Opt level: O1

int parser_skip_params(sf_parser *sfp)

{
  int iVar1;
  
  do {
    iVar1 = sf_parser_param(sfp,(sf_vec *)0x0,(sf_value *)0x0);
  } while (iVar1 == 0);
  if (iVar1 == -2) {
    iVar1 = 0;
  }
  else if (iVar1 != -1) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/winlibs[P]nghttp2/lib/sfparse.c"
                  ,0x2b9,"int parser_skip_params(sf_parser *)");
  }
  return iVar1;
}

Assistant:

static int parser_skip_params(sf_parser *sfp) {
  int rv;

  for (;;) {
    rv = sf_parser_param(sfp, NULL, NULL);
    switch (rv) {
    case 0:
      break;
    case SF_ERR_EOF:
      return 0;
    case SF_ERR_PARSE_ERROR:
      return rv;
    default:
      assert(0);
      abort();
    }
  }
}